

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-hmac.c
# Opt level: O3

int ndn_hmac_sha256(void *payload,uint32_t payload_length,ndn_hmac_key_t *hmac_key,
                   uint8_t *hmac_result)

{
  int iVar1;
  int iVar2;
  undefined1 local_118 [8];
  ndn_hmac_sha256_state_t s;
  
  iVar1 = (*ndn_hmac_backend.hmac_sha256_init)
                    ((abstract_hmac_sha256_state_t *)local_118,&hmac_key->abs_key);
  iVar2 = -0x19;
  if (iVar1 == 0) {
    iVar1 = (*ndn_hmac_backend.hmac_sha256_update)
                      ((abstract_hmac_sha256_state_t *)local_118,(uint8_t *)payload,payload_length);
    if (iVar1 == 0) {
      iVar1 = (*ndn_hmac_backend.hmac_sha256_final)
                        ((abstract_hmac_sha256_state_t *)local_118,hmac_result);
      iVar2 = -0x19;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
ndn_hmac_sha256(const void* payload, uint32_t payload_length,
                const ndn_hmac_key_t* hmac_key, uint8_t* hmac_result)
{
  ndn_hmac_sha256_state_t s;
  if (ndn_hmac_sha256_init(&s, hmac_key) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  if (ndn_hmac_sha256_update(&s, payload, payload_length) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  if (ndn_hmac_sha256_final(&s, hmac_result) != NDN_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  return NDN_SUCCESS;
}